

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

void __thiscall ObjectBlockPool<32,_2048>::~ObjectBlockPool(ObjectBlockPool<32,_2048> *this)

{
  Reset(this);
  if ((this->objectsToFree).data != (SmallBlock<32> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->objectsToFinalize).data != (SmallBlock<32> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  if ((this->sortedPages).data != (LargeBlock<32,_2048> **)0x0) {
    (*(code *)NULLC::dealloc)();
  }
  return;
}

Assistant:

~ObjectBlockPool()
	{
		Reset();
	}